

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O2

bool is_utf8(char *string)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  
  if (string == (char *)0x0) {
    return false;
  }
  lVar2 = 1;
  do {
    bVar1 = *string;
    lVar3 = lVar2;
    if ((1 < bVar1 - 9) && (bVar1 != 0xd)) {
      if (bVar1 == 0) {
        return true;
      }
      if (0x5e < (byte)(bVar1 - 0x20)) {
        if ((byte)(bVar1 + 0x3e) < 0x1e) {
          bVar1 = ((byte *)string)[1];
          lVar3 = 2;
        }
        else {
          lVar3 = 3;
          if (bVar1 == 0xe0) {
            if ((((byte *)string)[1] & 0xe0) != 0xa0) {
              return false;
            }
LAB_00134477:
            bVar1 = ((byte *)string)[2];
          }
          else {
            if ((((byte)(bVar1 + 0x1f) < 0xc || (bVar1 & 0xfe) == 0xee) &&
                ((char)((byte *)string)[1] < -0x40)) && ((char)((byte *)string)[2] < -0x40))
            goto LAB_001344c2;
            if (bVar1 == 0xf0) {
              if (0x2f < (byte)(((byte *)string)[1] + 0x70)) {
                return false;
              }
            }
            else {
              if (bVar1 == 0xed) {
                if (-0x61 < (char)((byte *)string)[1]) {
                  return false;
                }
                goto LAB_00134477;
              }
              if ((byte)(bVar1 + 0xf) < 3) {
                if (-0x41 < (char)((byte *)string)[1]) {
                  return false;
                }
              }
              else {
                if (bVar1 != 0xf4) {
                  return false;
                }
                if (-0x71 < (char)((byte *)string)[1]) {
                  return false;
                }
              }
            }
            if (-0x41 < (char)((byte *)string)[2]) {
              return false;
            }
            bVar1 = ((byte *)string)[3];
            lVar3 = 4;
          }
        }
        if (-0x41 < (char)bVar1) {
          return false;
        }
      }
    }
LAB_001344c2:
    string = (char *)((byte *)string + lVar3);
  } while( true );
}

Assistant:

bool is_utf8(const char * string)
{
	if (!string)
		return 0;

	const unsigned char * bytes = (const unsigned char *)string;
	while (*bytes)
	{
		if ((// ASCII
			// use bytes[0] <= 0x7F to allow ASCII control characters
			bytes[0] == 0x09 ||
			bytes[0] == 0x0A ||
			bytes[0] == 0x0D ||
			(0x20 <= bytes[0] && bytes[0] <= 0x7E)
			)
			) {
			bytes += 1;
			continue;
		}

		if ((// non-overlong 2-byte
			(0xC2 <= bytes[0] && bytes[0] <= 0xDF) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF)
			)
			) {
			bytes += 2;
			continue;
		}

		if ((// excluding overlongs
			bytes[0] == 0xE0 &&
			(0xA0 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			) ||
			(// straight 3-byte
			((0xE1 <= bytes[0] && bytes[0] <= 0xEC) ||
			bytes[0] == 0xEE ||
			bytes[0] == 0xEF) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			) ||
			(// excluding surrogates
			bytes[0] == 0xED &&
			(0x80 <= bytes[1] && bytes[1] <= 0x9F) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF)
			)
			) {
			bytes += 3;
			continue;
		}

		if ((// planes 1-3
			bytes[0] == 0xF0 &&
			(0x90 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			) ||
			(// planes 4-15
			(0xF1 <= bytes[0] && bytes[0] <= 0xF3) &&
			(0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			) ||
			(// plane 16
			bytes[0] == 0xF4 &&
			(0x80 <= bytes[1] && bytes[1] <= 0x8F) &&
			(0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
			(0x80 <= bytes[3] && bytes[3] <= 0xBF)
			)
			) {
			bytes += 4;
			continue;
		}
		return 0;
	}
	return 1;
}